

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

bool folded_normal_check(double a,double b)

{
  char *pcVar1;
  
  if (0.0 <= a) {
    if (0.0 < b) {
      return true;
    }
    pcVar1 = "  B <= 0.\n";
  }
  else {
    pcVar1 = "  A < 0.\n";
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"FOLDED_NORMAL_CHECK - Warning!\n");
  std::operator<<((ostream *)&std::cerr,pcVar1);
  return false;
}

Assistant:

bool folded_normal_check ( double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    FOLDED_NORMAL_CHECK checks the parameters of the Folded Normal CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 <= A,
//    0.0 < B.
//
//    Output, bool FOLDED_NORMAL_CHECK, is true if the parameters are legal.
//
{
  if ( a < 0.0 )
  {
    cerr << " \n";
    cerr << "FOLDED_NORMAL_CHECK - Warning!\n";
    cerr << "  A < 0.\n";
    return false;
  }

  if ( b <= 0.0 )
  {
    cerr << " \n";
    cerr << "FOLDED_NORMAL_CHECK - Warning!\n";
    cerr << "  B <= 0.\n";
    return false;
  }

  return true;
}